

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

void __thiscall
cppcms::application_specific_pool::_legacy_pool_policy::put
          (_legacy_pool_policy *this,application *app)

{
  size_type __n;
  reference ppaVar1;
  value_type in_RSI;
  long in_RDI;
  
  if (in_RSI != (value_type)0x0) {
    if ((*(ulong *)(in_RDI + 0x48) <= *(ulong *)(in_RDI + 0x40)) && (in_RSI != (value_type)0x0)) {
      (*in_RSI->_vptr_application[1])();
    }
    __n = *(size_type *)(in_RDI + 0x40);
    *(size_type *)(in_RDI + 0x40) = __n + 1;
    ppaVar1 = std::vector<cppcms::application_*,_std::allocator<cppcms::application_*>_>::operator[]
                        ((vector<cppcms::application_*,_std::allocator<cppcms::application_*>_> *)
                         (in_RDI + 0x18),__n);
    *ppaVar1 = in_RSI;
  }
  return;
}

Assistant:

virtual void put(application *app)
	{
		if(!app)
			return;
		// must never heppen start
		if(size_ >= limit_)
			delete app;
		// must never happend end
		apps_[size_++] = app;
	}